

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_sse2.c
# Opt level: O1

void av1_dist_wtd_convolve_2d_copy_sse2
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params)

{
  CONV_BUF_TYPE *pCVar1;
  uint8_t *puVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  uint uVar43;
  CONV_BUF_TYPE *pCVar44;
  char cVar45;
  int iVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  short sVar50;
  short sVar52;
  undefined1 auVar51 [16];
  short sVar53;
  short sVar55;
  undefined1 auVar54 [16];
  undefined4 uVar56;
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  CONV_BUF_TYPE CVar64;
  CONV_BUF_TYPE CVar73;
  CONV_BUF_TYPE CVar74;
  CONV_BUF_TYPE CVar75;
  CONV_BUF_TYPE CVar76;
  CONV_BUF_TYPE CVar77;
  CONV_BUF_TYPE CVar78;
  undefined1 auVar65 [16];
  CONV_BUF_TYPE CVar79;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  CONV_BUF_TYPE CVar80;
  CONV_BUF_TYPE CVar90;
  CONV_BUF_TYPE CVar91;
  CONV_BUF_TYPE CVar92;
  CONV_BUF_TYPE CVar93;
  CONV_BUF_TYPE CVar94;
  CONV_BUF_TYPE CVar95;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  CONV_BUF_TYPE CVar96;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  
  pCVar44 = conv_params->dst;
  iVar4 = conv_params->dst_stride;
  iVar46 = conv_params->round_0 + conv_params->round_1;
  uVar43 = 0xe - iVar46;
  iVar5 = conv_params->do_average;
  iVar6 = conv_params->use_dist_wtd_comp_avg;
  auVar48 = ZEXT416(uVar43);
  auVar49._0_4_ = CONCAT22((short)conv_params->bck_offset,(short)conv_params->fwd_offset);
  auVar49._4_4_ = auVar49._0_4_;
  auVar49._8_4_ = auVar49._0_4_;
  auVar49._12_4_ = auVar49._0_4_;
  cVar45 = (char)iVar46;
  auVar51 = ZEXT416((uint)((1 << (0x15U - cVar45 & 0x1f)) + (1 << (0x16U - cVar45 & 0x1f))));
  auVar51 = pshuflw(auVar51,auVar51,0);
  auVar54 = ZEXT416((uint)(1 << ((byte)uVar43 & 0x1f)) >> 1);
  auVar54 = pshuflw(auVar54,auVar54,0);
  sVar50 = auVar51._0_2_;
  sVar52 = auVar51._2_2_;
  sVar53 = auVar54._0_2_;
  sVar55 = auVar54._2_2_;
  if ((w & 0xfU) == 0) {
    if (0 < h) {
      iVar46 = 0;
      do {
        if (0 < w) {
          lVar47 = 0;
          do {
            auVar51 = *(undefined1 (*) [16])(src + lVar47);
            auVar24[0xd] = 0;
            auVar24._0_13_ = auVar51._0_13_;
            auVar24[0xe] = auVar51[7];
            auVar26[0xc] = auVar51[6];
            auVar26._0_12_ = auVar51._0_12_;
            auVar26._13_2_ = auVar24._13_2_;
            auVar28[0xb] = 0;
            auVar28._0_11_ = auVar51._0_11_;
            auVar28._12_3_ = auVar26._12_3_;
            auVar30[10] = auVar51[5];
            auVar30._0_10_ = auVar51._0_10_;
            auVar30._11_4_ = auVar28._11_4_;
            auVar32[9] = 0;
            auVar32._0_9_ = auVar51._0_9_;
            auVar32._10_5_ = auVar30._10_5_;
            auVar34[8] = auVar51[4];
            auVar34._0_8_ = auVar51._0_8_;
            auVar34._9_6_ = auVar32._9_6_;
            auVar38._7_8_ = 0;
            auVar38._0_7_ = auVar34._8_7_;
            auVar41._1_8_ = SUB158(auVar38 << 0x40,7);
            auVar41[0] = auVar51[3];
            auVar41._9_6_ = 0;
            auVar42._1_10_ = SUB1510(auVar41 << 0x30,5);
            auVar42[0] = auVar51[2];
            auVar42._11_4_ = 0;
            auVar36[2] = auVar51[1];
            auVar36._0_2_ = auVar51._0_2_;
            auVar36._3_12_ = SUB1512(auVar42 << 0x20,3);
            auVar99._0_2_ = auVar51._0_2_ & 0xff;
            auVar99._2_13_ = auVar36._2_13_;
            auVar99[0xf] = 0;
            auVar54[1] = 0;
            auVar54[0] = auVar51[8];
            auVar54[2] = auVar51[9];
            auVar54[3] = 0;
            auVar54[4] = auVar51[10];
            auVar54[5] = 0;
            auVar54[6] = auVar51[0xb];
            auVar54[7] = 0;
            auVar54[8] = auVar51[0xc];
            auVar54[9] = 0;
            auVar54[10] = auVar51[0xd];
            auVar54[0xb] = 0;
            auVar54[0xc] = auVar51[0xe];
            auVar54[0xd] = 0;
            auVar54[0xe] = auVar51[0xf];
            auVar54[0xf] = 0;
            auVar51 = psllw(auVar99,auVar48);
            CVar80 = auVar51._0_2_ + sVar50;
            CVar90 = auVar51._2_2_ + sVar52;
            CVar91 = auVar51._4_2_ + sVar50;
            CVar92 = auVar51._6_2_ + sVar52;
            CVar93 = auVar51._8_2_ + sVar50;
            CVar94 = auVar51._10_2_ + sVar52;
            CVar95 = auVar51._12_2_ + sVar50;
            CVar96 = auVar51._14_2_ + sVar52;
            auVar51 = psllw(auVar54,auVar48);
            CVar64 = auVar51._0_2_ + sVar50;
            CVar73 = auVar51._2_2_ + sVar52;
            CVar74 = auVar51._4_2_ + sVar50;
            CVar75 = auVar51._6_2_ + sVar52;
            CVar76 = auVar51._8_2_ + sVar50;
            CVar77 = auVar51._10_2_ + sVar52;
            CVar78 = auVar51._12_2_ + sVar50;
            CVar79 = auVar51._14_2_ + sVar52;
            if (iVar5 == 0) {
              pCVar1 = pCVar44 + lVar47;
              *pCVar1 = CVar80;
              pCVar1[1] = CVar90;
              pCVar1[2] = CVar91;
              pCVar1[3] = CVar92;
              pCVar1[4] = CVar93;
              pCVar1[5] = CVar94;
              pCVar1[6] = CVar95;
              pCVar1[7] = CVar96;
              pCVar1 = pCVar44 + lVar47 + 8;
              *pCVar1 = CVar64;
              pCVar1[1] = CVar73;
              pCVar1[2] = CVar74;
              pCVar1[3] = CVar75;
              pCVar1[4] = CVar76;
              pCVar1[5] = CVar77;
              pCVar1[6] = CVar78;
              pCVar1[7] = CVar79;
            }
            else {
              auVar51 = *(undefined1 (*) [16])(pCVar44 + lVar47);
              if (iVar6 == 0) {
                auVar83._0_2_ = CVar80 + auVar51._0_2_;
                auVar83._2_2_ = CVar90 + auVar51._2_2_;
                auVar83._4_2_ = CVar91 + auVar51._4_2_;
                auVar83._6_2_ = CVar92 + auVar51._6_2_;
                auVar83._8_2_ = CVar93 + auVar51._8_2_;
                auVar83._10_2_ = CVar94 + auVar51._10_2_;
                auVar83._12_2_ = CVar95 + auVar51._12_2_;
                auVar83._14_2_ = CVar96 + auVar51._14_2_;
                auVar51 = psraw(auVar83,1);
              }
              else {
                auVar70._0_12_ = auVar51._0_12_;
                auVar70._12_2_ = auVar51._6_2_;
                auVar70._14_2_ = CVar92;
                auVar69._12_4_ = auVar70._12_4_;
                auVar69._0_10_ = auVar51._0_10_;
                auVar69._10_2_ = CVar91;
                auVar68._10_6_ = auVar69._10_6_;
                auVar68._0_8_ = auVar51._0_8_;
                auVar68._8_2_ = auVar51._4_2_;
                auVar67._8_8_ = auVar68._8_8_;
                auVar67._6_2_ = CVar90;
                auVar67._4_2_ = auVar51._2_2_;
                auVar67._2_2_ = CVar80;
                auVar67._0_2_ = auVar51._0_2_;
                auVar97._2_2_ = CVar93;
                auVar97._0_2_ = auVar51._8_2_;
                auVar97._4_2_ = auVar51._10_2_;
                auVar97._6_2_ = CVar94;
                auVar97._8_2_ = auVar51._12_2_;
                auVar97._10_2_ = CVar95;
                auVar97._12_2_ = auVar51._14_2_;
                auVar97._14_2_ = CVar96;
                auVar51 = pmaddwd(auVar67,auVar49);
                auVar54 = pmaddwd(auVar97,auVar49);
                auVar71._0_4_ = auVar51._0_4_ >> 4;
                auVar71._4_4_ = auVar51._4_4_ >> 4;
                auVar71._8_4_ = auVar51._8_4_ >> 4;
                auVar71._12_4_ = auVar51._12_4_ >> 4;
                auVar51._0_4_ = auVar54._0_4_ >> 4;
                auVar51._4_4_ = auVar54._4_4_ >> 4;
                auVar51._8_4_ = auVar54._8_4_ >> 4;
                auVar51._12_4_ = auVar54._12_4_ >> 4;
                auVar51 = packssdw(auVar71,auVar51);
              }
              auVar54 = *(undefined1 (*) [16])(pCVar44 + lVar47 + 8);
              if (iVar6 == 0) {
                auVar63._0_2_ = CVar64 + auVar54._0_2_;
                auVar63._2_2_ = CVar73 + auVar54._2_2_;
                auVar63._4_2_ = CVar74 + auVar54._4_2_;
                auVar63._6_2_ = CVar75 + auVar54._6_2_;
                auVar63._8_2_ = CVar76 + auVar54._8_2_;
                auVar63._10_2_ = CVar77 + auVar54._10_2_;
                auVar63._12_2_ = CVar78 + auVar54._12_2_;
                auVar63._14_2_ = CVar79 + auVar54._14_2_;
                auVar54 = psraw(auVar63,1);
              }
              else {
                auVar87._0_12_ = auVar54._0_12_;
                auVar87._12_2_ = auVar54._6_2_;
                auVar87._14_2_ = CVar75;
                auVar86._12_4_ = auVar87._12_4_;
                auVar86._0_10_ = auVar54._0_10_;
                auVar86._10_2_ = CVar74;
                auVar85._10_6_ = auVar86._10_6_;
                auVar85._0_8_ = auVar54._0_8_;
                auVar85._8_2_ = auVar54._4_2_;
                auVar84._8_8_ = auVar85._8_8_;
                auVar84._6_2_ = CVar73;
                auVar84._4_2_ = auVar54._2_2_;
                auVar84._2_2_ = CVar64;
                auVar84._0_2_ = auVar54._0_2_;
                auVar98._2_2_ = CVar76;
                auVar98._0_2_ = auVar54._8_2_;
                auVar98._4_2_ = auVar54._10_2_;
                auVar98._6_2_ = CVar77;
                auVar98._8_2_ = auVar54._12_2_;
                auVar98._10_2_ = CVar78;
                auVar98._12_2_ = auVar54._14_2_;
                auVar98._14_2_ = CVar79;
                auVar54 = pmaddwd(auVar84,auVar49);
                auVar99 = pmaddwd(auVar98,auVar49);
                auVar88._0_4_ = auVar54._0_4_ >> 4;
                auVar88._4_4_ = auVar54._4_4_ >> 4;
                auVar88._8_4_ = auVar54._8_4_ >> 4;
                auVar88._12_4_ = auVar54._12_4_ >> 4;
                auVar100._0_4_ = auVar99._0_4_ >> 4;
                auVar100._4_4_ = auVar99._4_4_ >> 4;
                auVar100._8_4_ = auVar99._8_4_ >> 4;
                auVar100._12_4_ = auVar99._12_4_ >> 4;
                auVar54 = packssdw(auVar88,auVar100);
              }
              auVar72._0_2_ = auVar51._0_2_ + (sVar53 - sVar50);
              auVar72._2_2_ = auVar51._2_2_ + (sVar55 - sVar52);
              auVar72._4_2_ = auVar51._4_2_ + (sVar53 - sVar50);
              auVar72._6_2_ = auVar51._6_2_ + (sVar55 - sVar52);
              auVar72._8_2_ = auVar51._8_2_ + (sVar53 - sVar50);
              auVar72._10_2_ = auVar51._10_2_ + (sVar55 - sVar52);
              auVar72._12_2_ = auVar51._12_2_ + (sVar53 - sVar50);
              auVar72._14_2_ = auVar51._14_2_ + (sVar55 - sVar52);
              auVar51 = psraw(auVar72,auVar48);
              auVar89._0_2_ = auVar54._0_2_ + (sVar53 - sVar50);
              auVar89._2_2_ = auVar54._2_2_ + (sVar55 - sVar52);
              auVar89._4_2_ = auVar54._4_2_ + (sVar53 - sVar50);
              auVar89._6_2_ = auVar54._6_2_ + (sVar55 - sVar52);
              auVar89._8_2_ = auVar54._8_2_ + (sVar53 - sVar50);
              auVar89._10_2_ = auVar54._10_2_ + (sVar55 - sVar52);
              auVar89._12_2_ = auVar54._12_2_ + (sVar53 - sVar50);
              auVar89._14_2_ = auVar54._14_2_ + (sVar55 - sVar52);
              auVar54 = psraw(auVar89,auVar48);
              sVar7 = auVar51._0_2_;
              sVar8 = auVar51._2_2_;
              sVar9 = auVar51._4_2_;
              sVar10 = auVar51._6_2_;
              sVar11 = auVar51._8_2_;
              sVar12 = auVar51._10_2_;
              sVar13 = auVar51._12_2_;
              sVar14 = auVar51._14_2_;
              sVar15 = auVar54._0_2_;
              sVar16 = auVar54._2_2_;
              sVar17 = auVar54._4_2_;
              sVar18 = auVar54._6_2_;
              sVar19 = auVar54._8_2_;
              sVar20 = auVar54._10_2_;
              sVar21 = auVar54._12_2_;
              sVar22 = auVar54._14_2_;
              puVar2 = dst0 + lVar47;
              *puVar2 = (0 < sVar7) * (sVar7 < 0x100) * auVar51[0] - (0xff < sVar7);
              puVar2[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar51[2] - (0xff < sVar8);
              puVar2[2] = (0 < sVar9) * (sVar9 < 0x100) * auVar51[4] - (0xff < sVar9);
              puVar2[3] = (0 < sVar10) * (sVar10 < 0x100) * auVar51[6] - (0xff < sVar10);
              puVar2[4] = (0 < sVar11) * (sVar11 < 0x100) * auVar51[8] - (0xff < sVar11);
              puVar2[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar51[10] - (0xff < sVar12);
              puVar2[6] = (0 < sVar13) * (sVar13 < 0x100) * auVar51[0xc] - (0xff < sVar13);
              puVar2[7] = (0 < sVar14) * (sVar14 < 0x100) * auVar51[0xe] - (0xff < sVar14);
              puVar2[8] = (0 < sVar15) * (sVar15 < 0x100) * auVar54[0] - (0xff < sVar15);
              puVar2[9] = (0 < sVar16) * (sVar16 < 0x100) * auVar54[2] - (0xff < sVar16);
              puVar2[10] = (0 < sVar17) * (sVar17 < 0x100) * auVar54[4] - (0xff < sVar17);
              puVar2[0xb] = (0 < sVar18) * (sVar18 < 0x100) * auVar54[6] - (0xff < sVar18);
              puVar2[0xc] = (0 < sVar19) * (sVar19 < 0x100) * auVar54[8] - (0xff < sVar19);
              puVar2[0xd] = (0 < sVar20) * (sVar20 < 0x100) * auVar54[10] - (0xff < sVar20);
              puVar2[0xe] = (0 < sVar21) * (sVar21 < 0x100) * auVar54[0xc] - (0xff < sVar21);
              puVar2[0xf] = (0 < sVar22) * (sVar22 < 0x100) * auVar54[0xe] - (0xff < sVar22);
            }
            lVar47 = lVar47 + 0x10;
          } while (lVar47 < w);
        }
        src = src + src_stride;
        dst0 = dst0 + dst_stride0;
        iVar46 = iVar46 + 1;
        pCVar44 = pCVar44 + iVar4;
      } while (iVar46 != h);
    }
  }
  else if (0 < h) {
    iVar46 = 0;
    do {
      if (0 < w) {
        lVar47 = 0;
        do {
          uVar3 = *(ulong *)(src + lVar47);
          auVar23._8_6_ = 0;
          auVar23._0_8_ = uVar3;
          auVar23[0xe] = (char)(uVar3 >> 0x38);
          auVar25._8_4_ = 0;
          auVar25._0_8_ = uVar3;
          auVar25[0xc] = (char)(uVar3 >> 0x30);
          auVar25._13_2_ = auVar23._13_2_;
          auVar27._8_4_ = 0;
          auVar27._0_8_ = uVar3;
          auVar27._12_3_ = auVar25._12_3_;
          auVar29._8_2_ = 0;
          auVar29._0_8_ = uVar3;
          auVar29[10] = (char)(uVar3 >> 0x28);
          auVar29._11_4_ = auVar27._11_4_;
          auVar31._8_2_ = 0;
          auVar31._0_8_ = uVar3;
          auVar31._10_5_ = auVar29._10_5_;
          auVar33[8] = (char)(uVar3 >> 0x20);
          auVar33._0_8_ = uVar3;
          auVar33._9_6_ = auVar31._9_6_;
          auVar37._7_8_ = 0;
          auVar37._0_7_ = auVar33._8_7_;
          auVar39._1_8_ = SUB158(auVar37 << 0x40,7);
          auVar39[0] = (char)(uVar3 >> 0x18);
          auVar39._9_6_ = 0;
          auVar40._1_10_ = SUB1510(auVar39 << 0x30,5);
          auVar40[0] = (char)(uVar3 >> 0x10);
          auVar40._11_4_ = 0;
          auVar35[2] = (char)(uVar3 >> 8);
          auVar35._0_2_ = (ushort)uVar3;
          auVar35._3_12_ = SUB1512(auVar40 << 0x20,3);
          auVar65._0_2_ = (ushort)uVar3 & 0xff;
          auVar65._2_13_ = auVar35._2_13_;
          auVar65[0xf] = 0;
          auVar51 = psllw(auVar65,auVar48);
          CVar64 = auVar51._0_2_ + sVar50;
          CVar73 = auVar51._2_2_ + sVar52;
          CVar74 = auVar51._4_2_ + sVar50;
          CVar75 = auVar51._6_2_ + sVar52;
          CVar76 = auVar51._8_2_ + sVar50;
          CVar77 = auVar51._10_2_ + sVar52;
          CVar78 = auVar51._12_2_ + sVar50;
          CVar79 = auVar51._14_2_ + sVar52;
          if (iVar5 == 0) {
            pCVar1 = pCVar44 + lVar47;
            *pCVar1 = CVar64;
            pCVar1[1] = CVar73;
            pCVar1[2] = CVar74;
            pCVar1[3] = CVar75;
            pCVar1[4] = CVar76;
            pCVar1[5] = CVar77;
            pCVar1[6] = CVar78;
            pCVar1[7] = CVar79;
          }
          else {
            auVar51 = *(undefined1 (*) [16])(pCVar44 + lVar47);
            if (iVar6 == 0) {
              auVar66._0_2_ = CVar64 + auVar51._0_2_;
              auVar66._2_2_ = CVar73 + auVar51._2_2_;
              auVar66._4_2_ = CVar74 + auVar51._4_2_;
              auVar66._6_2_ = CVar75 + auVar51._6_2_;
              auVar66._8_2_ = CVar76 + auVar51._8_2_;
              auVar66._10_2_ = CVar77 + auVar51._10_2_;
              auVar66._12_2_ = CVar78 + auVar51._12_2_;
              auVar66._14_2_ = CVar79 + auVar51._14_2_;
              auVar51 = psraw(auVar66,1);
            }
            else {
              auVar60._0_12_ = auVar51._0_12_;
              auVar60._12_2_ = auVar51._6_2_;
              auVar60._14_2_ = CVar75;
              auVar59._12_4_ = auVar60._12_4_;
              auVar59._0_10_ = auVar51._0_10_;
              auVar59._10_2_ = CVar74;
              auVar58._10_6_ = auVar59._10_6_;
              auVar58._0_8_ = auVar51._0_8_;
              auVar58._8_2_ = auVar51._4_2_;
              auVar57._8_8_ = auVar58._8_8_;
              auVar57._6_2_ = CVar73;
              auVar57._4_2_ = auVar51._2_2_;
              auVar57._2_2_ = CVar64;
              auVar57._0_2_ = auVar51._0_2_;
              auVar81._2_2_ = CVar76;
              auVar81._0_2_ = auVar51._8_2_;
              auVar81._4_2_ = auVar51._10_2_;
              auVar81._6_2_ = CVar77;
              auVar81._8_2_ = auVar51._12_2_;
              auVar81._10_2_ = CVar78;
              auVar81._12_2_ = auVar51._14_2_;
              auVar81._14_2_ = CVar79;
              auVar51 = pmaddwd(auVar57,auVar49);
              auVar54 = pmaddwd(auVar81,auVar49);
              auVar61._0_4_ = auVar51._0_4_ >> 4;
              auVar61._4_4_ = auVar51._4_4_ >> 4;
              auVar61._8_4_ = auVar51._8_4_ >> 4;
              auVar61._12_4_ = auVar51._12_4_ >> 4;
              auVar82._0_4_ = auVar54._0_4_ >> 4;
              auVar82._4_4_ = auVar54._4_4_ >> 4;
              auVar82._8_4_ = auVar54._8_4_ >> 4;
              auVar82._12_4_ = auVar54._12_4_ >> 4;
              auVar51 = packssdw(auVar61,auVar82);
            }
            auVar62._0_2_ = auVar51._0_2_ + (sVar53 - sVar50);
            auVar62._2_2_ = auVar51._2_2_ + (sVar55 - sVar52);
            auVar62._4_2_ = auVar51._4_2_ + (sVar53 - sVar50);
            auVar62._6_2_ = auVar51._6_2_ + (sVar55 - sVar52);
            auVar62._8_2_ = auVar51._8_2_ + (sVar53 - sVar50);
            auVar62._10_2_ = auVar51._10_2_ + (sVar55 - sVar52);
            auVar62._12_2_ = auVar51._12_2_ + (sVar53 - sVar50);
            auVar62._14_2_ = auVar51._14_2_ + (sVar55 - sVar52);
            auVar51 = psraw(auVar62,auVar48);
            sVar7 = auVar51._0_2_;
            sVar8 = auVar51._2_2_;
            sVar9 = auVar51._4_2_;
            sVar10 = auVar51._6_2_;
            uVar56 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar51[6] - (0xff < sVar10),
                              CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar51[4] - (0xff < sVar9),
                                       CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar51[2] -
                                                (0xff < sVar8),
                                                (0 < sVar7) * (sVar7 < 0x100) * auVar51[0] -
                                                (0xff < sVar7))));
            sVar7 = auVar51._8_2_;
            sVar8 = auVar51._10_2_;
            sVar9 = auVar51._12_2_;
            sVar10 = auVar51._14_2_;
            if (w < 5) {
              *(undefined4 *)(dst0 + lVar47) = uVar56;
            }
            else {
              *(ulong *)(dst0 + lVar47) =
                   CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar51[0xe] - (0xff < sVar10),
                            CONCAT16((0 < sVar9) * (sVar9 < 0x100) * auVar51[0xc] - (0xff < sVar9),
                                     CONCAT15((0 < sVar8) * (sVar8 < 0x100) * auVar51[10] -
                                              (0xff < sVar8),
                                              CONCAT14((0 < sVar7) * (sVar7 < 0x100) * auVar51[8] -
                                                       (0xff < sVar7),uVar56))));
            }
          }
          lVar47 = lVar47 + 8;
        } while (lVar47 < w);
      }
      src = src + src_stride;
      dst0 = dst0 + dst_stride0;
      iVar46 = iVar46 + 1;
      pCVar44 = pCVar44 + iVar4;
    } while (iVar46 != h);
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_copy_sse2(const uint8_t *src, int src_stride,
                                        uint8_t *dst0, int dst_stride0, int w,
                                        int h, ConvolveParams *conv_params) {
  const int bd = 8;
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const __m128i zero = _mm_setzero_si128();
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  int i, j;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);

  assert((w % 4) == 0);

  if (!(w % 16)) {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 16) {
        const __m128i d8 = _mm_loadu_si128((__m128i *)&src[j]);

        const __m128i d16_lo = _mm_unpacklo_epi8(d8, zero);
        const __m128i d16_hi = _mm_unpackhi_epi8(d8, zero);

        const __m128i res_lo = _mm_sll_epi16(d16_lo, left_shift);
        const __m128i res_unsigned_lo = _mm_add_epi16(res_lo, offset_const);

        const __m128i res_hi = _mm_sll_epi16(d16_hi, left_shift);
        const __m128i res_unsigned_hi = _mm_add_epi16(res_hi, offset_const);

        if (do_average) {
          const __m128i data_ref_0_lo = _mm_loadu_si128((__m128i *)(&dst[j]));
          const __m128i data_ref_0_hi =
              _mm_loadu_si128((__m128i *)(&dst[j + 8]));

          const __m128i comp_avg_res_lo = comp_avg(
              &data_ref_0_lo, &res_unsigned_lo, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result_lo = convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);

          const __m128i comp_avg_res_hi = comp_avg(
              &data_ref_0_hi, &res_unsigned_hi, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result_hi = convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 =
              _mm_packus_epi16(round_result_lo, round_result_hi);

          _mm_store_si128((__m128i *)(&dst0[j]), res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[j]), res_unsigned_lo);
          _mm_store_si128((__m128i *)(&dst[j + 8]), res_unsigned_hi);
        }
      }
      src += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    }
  } else {
    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i d8 = _mm_loadl_epi64((__m128i *)&src[j]);
        const __m128i d16_0 = _mm_unpacklo_epi8(d8, zero);

        const __m128i res = _mm_sll_epi16(d16_0, left_shift);
        const __m128i res_unsigned = _mm_add_epi16(res, offset_const);

        if (do_average) {
          const __m128i data_ref_0 = _mm_loadu_si128((__m128i *)(&dst[j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);

          if (w > 4)
            _mm_storel_epi64((__m128i *)(&dst0[j]), res_8);
          else
            *(int *)(&dst0[j]) = _mm_cvtsi128_si32(res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[j]), res_unsigned);
        }
      }
      src += src_stride;
      dst += dst_stride;
      dst0 += dst_stride0;
    }
  }
}